

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.c
# Opt level: O2

void den_terms_ci(float64 **d_term,float64 post_j,float64 *p_ci_op,float64 **den,uint32 **den_idx,
                 float32 **mixw,uint32 n_feat,uint32 n_top)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  
  for (uVar2 = 0; uVar2 != n_feat; uVar2 = uVar2 + 1) {
    dVar1 = (double)p_ci_op[uVar2];
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      for (uVar3 = 0; n_top != uVar3; uVar3 = uVar3 + 1) {
        d_term[uVar2][uVar3] =
             (float64)((double)(float)mixw[uVar2][den_idx[uVar2][uVar3]] * (double)den[uVar2][uVar3]
                       * (1.0 / dVar1) * (double)post_j);
      }
    }
    else {
      for (uVar3 = 0; n_top != uVar3; uVar3 = uVar3 + 1) {
        d_term[uVar2][uVar3] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void
den_terms_ci(float64 **d_term,

	     float64 post_j,
	     float64 *p_ci_op,
	     float64 **den,
	     uint32  **den_idx,
	     float32 **mixw,
	     uint32 n_feat,
	     uint32 n_top)
{
    uint32 j, k, kk;
    float64 inv_ci_op;

    for (j = 0; j < n_feat; j++) {
	if (p_ci_op[j] != 0) {
	    inv_ci_op = 1.0 / p_ci_op[j];

	    for (kk = 0; kk < n_top; kk++) {
		/* density index k for one of the n_top density values */
		k = den_idx[j][kk];
		
		d_term[j][kk] = mixw[j][k] * den[j][kk] * inv_ci_op * post_j;
	    }
	}
	else {
	    for (kk = 0; kk < n_top; kk++) {
		d_term[j][kk] = 0;
	    }
	}
    }
}